

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O2

void __thiscall ncnn::Proposal::Proposal(Proposal *this)

{
  undefined8 *puVar1;
  
  Layer::Layer(&this->super_Layer);
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR__Proposal_005727b0;
  (this->anchors).cstep = 0;
  (this->super_Layer).one_blob_only = false;
  (this->super_Layer).support_inplace = false;
  (this->ratios).data = (void *)0x0;
  (this->ratios).refcount = (int *)0x0;
  *(undefined8 *)((long)&(this->ratios).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->ratios).elemsize + 4) = 0;
  (this->ratios).allocator = (Allocator *)0x0;
  (this->ratios).dims = 0;
  (this->ratios).w = 0;
  (this->ratios).w = 0;
  (this->ratios).h = 0;
  (this->ratios).d = 0;
  (this->ratios).c = 0;
  (this->ratios).cstep = 0;
  (this->scales).data = (void *)0x0;
  (this->scales).refcount = (int *)0x0;
  (this->scales).elemsize = 0;
  (this->scales).elempack = 0;
  (this->scales).allocator = (Allocator *)0x0;
  (this->scales).dims = 0;
  (this->scales).w = 0;
  (this->scales).w = 0;
  (this->scales).h = 0;
  (this->scales).d = 0;
  (this->scales).c = 0;
  (this->anchors).elempack = 0;
  (this->scales).cstep = 0;
  (this->anchors).data = (void *)0x0;
  (this->anchors).refcount = (int *)0x0;
  (this->anchors).elemsize = 0;
  (this->anchors).allocator = (Allocator *)0x0;
  (this->anchors).dims = 0;
  (this->anchors).w = 0;
  (this->anchors).w = 0;
  (this->anchors).h = 0;
  (this->anchors).d = 0;
  (this->anchors).c = 0;
  Mat::create(&this->ratios,3,4,(Allocator *)0x0);
  puVar1 = (undefined8 *)(this->ratios).data;
  *puVar1 = 0x3f8000003f000000;
  *(undefined4 *)(puVar1 + 1) = 0x40000000;
  Mat::create(&this->scales,3,4,(Allocator *)0x0);
  puVar1 = (undefined8 *)(this->scales).data;
  *puVar1 = 0x4180000041000000;
  *(undefined4 *)(puVar1 + 1) = 0x42000000;
  return;
}

Assistant:

Proposal::Proposal()
{
    one_blob_only = false;
    support_inplace = false;

    // TODO load from param
    ratios.create(3);
    ratios[0] = 0.5f;
    ratios[1] = 1.f;
    ratios[2] = 2.f;

    scales.create(3);
    scales[0] = 8.f;
    scales[1] = 16.f;
    scales[2] = 32.f;
}